

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetFieldOrdinal
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  pointer pbVar1;
  __type _Var2;
  LogMessage *pLVar3;
  long lVar4;
  int i;
  ulong uVar5;
  LogFinisher local_59;
  LogMessage local_58;
  
  lVar4 = 0;
  for (uVar5 = 0;
      pbVar1 = (this->field_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->field_names_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar5 = uVar5 + 1) {
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar4),
                            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             descriptor);
    if (_Var2) goto LAB_0028985c;
    lVar4 = lVar4 + 0x20;
  }
  internal::LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_message.cc"
             ,0x21b);
  pLVar3 = internal::LogMessage::operator<<(&local_58,"Could not find ordinal for field ");
  pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)descriptor);
  internal::LogFinisher::operator=(&local_59,pLVar3);
  internal::LogMessage::~LogMessage(&local_58);
  uVar5 = 0xffffffffffffffff;
LAB_0028985c:
  return (int)uVar5;
}

Assistant:

int MessageGenerator::GetFieldOrdinal(const FieldDescriptor* descriptor) {
  for (int i = 0; i < field_names().size(); i++) {
    if (field_names()[i] == descriptor->name()) {
      return i;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find ordinal for field " << descriptor->name();
  return -1;
}